

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  ulong uVar1;
  int iVar2;
  long in_FS_OFFSET;
  Slice user_key;
  string tmp;
  pointer local_60;
  ulong local_58;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = key->_M_string_length;
  if (uVar1 < 8) {
    __assert_fail("internal_key.size() >= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                  ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
  }
  local_60 = (key->_M_dataplus)._M_p;
  local_58 = uVar1 - 8;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,local_60,local_60 + (uVar1 - 8));
  (*this->user_comparator_->_vptr_Comparator[5])(this->user_comparator_,&local_50);
  if (CONCAT44(local_50._M_string_length._4_4_,(undefined4)local_50._M_string_length) < uVar1 - 8) {
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_60);
    if (iVar2 < 0) {
      PutFixed64(&local_50,0xffffffffffffff01);
      iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
      if (-1 < iVar2) {
        __assert_fail("this->Compare(*key, tmp) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                      ,0x5f,
                      "virtual void leveldb::InternalKeyComparator::FindShortSuccessor(std::string *) const"
                     );
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                (key,&local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string* key) const {
  Slice user_key = ExtractUserKey(*key);
  std::string tmp(user_key.data(), user_key.size());
  user_comparator_->FindShortSuccessor(&tmp);
  if (tmp.size() < user_key.size() &&
      user_comparator_->Compare(user_key, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*key, tmp) < 0);
    key->swap(tmp);
  }
}